

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nbutil.c
# Opt level: O0

void gai_nb_init(void)

{
  char *__nptr;
  char *value;
  int i;
  Integer in_stack_00000188;
  char *in_stack_00000190;
  int local_4;
  
  nb_max_outstanding = 0x100;
  __nptr = getenv("COMEX_MAX_NB_OUTSTANDING");
  if (__nptr != (char *)0x0) {
    nb_max_outstanding = atoi(__nptr);
  }
  if ((nb_max_outstanding < 1) || (0x100 < nb_max_outstanding)) {
    pnga_error(in_stack_00000190,in_stack_00000188);
  }
  for (local_4 = 0; local_4 < nb_max_outstanding; local_4 = local_4 + 1) {
    ga_ihdl_array[local_4].ahandle = (ga_armcihdl_t *)0x0;
    ga_ihdl_array[local_4].count = 0;
    ga_ihdl_array[local_4].active = 0;
    ga_ihdl_array[local_4].ga_nbtag = -1;
    armci_ihdl_array[local_4].next = (struct_armcihdl_t *)0x0;
    armci_ihdl_array[local_4].previous = (struct_armcihdl_t *)0x0;
    armci_ihdl_array[local_4].active = 0;
  }
  return;
}

Assistant:

void gai_nb_init()
{
  int i;
  char *value;
  /* This is a hideous kluge, but some users want to be able to set this
   * externally. The fact that only integer handles are exchanged between GA and
   * the underlying runtime make it very difficult to handle in a more elegant
   * manner. */
  nb_max_outstanding = MAX_NUM_NB_HDLS; /* default */
  value = getenv("COMEX_MAX_NB_OUTSTANDING");
  if (NULL != value) {
    nb_max_outstanding = atoi(value);
  }
  if (nb_max_outstanding <1 || nb_max_outstanding > MAX_NUM_NB_HDLS) {
    pnga_error("Illegal number of outstanding Non-block requests specified",
        nb_max_outstanding);
  }
  for (i=0; i<nb_max_outstanding; i++) {
    ga_ihdl_array[i].ahandle = NULL;
    ga_ihdl_array[i].count = 0;
    ga_ihdl_array[i].active = 0;
    ga_ihdl_array[i].ga_nbtag = -1;
    armci_ihdl_array[i].next = NULL;
    armci_ihdl_array[i].previous = NULL;
    armci_ihdl_array[i].active = 0;
    ARMCI_INIT_HANDLE(&armci_ihdl_array[i].handle);
  }
}